

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void delete_cb(Fl_Widget *param_1,void *param_2)

{
  bool bVar1;
  Fl_Type *local_20;
  Fl_Type *p;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  if (Fl_Type::current == (Fl_Type *)0x0) {
    fl_beep(0);
  }
  else {
    undo_checkpoint();
    set_modflag(1);
    ipasteoffset = 0;
    local_20 = Fl_Type::current->parent;
    while( true ) {
      bVar1 = false;
      if (local_20 != (Fl_Type *)0x0) {
        bVar1 = local_20->selected != '\0';
      }
      if (!bVar1) break;
      local_20 = local_20->parent;
    }
    delete_all(1);
    if (local_20 != (Fl_Type *)0x0) {
      select_only(local_20);
    }
  }
  return;
}

Assistant:

void delete_cb(Fl_Widget *, void *) {
  if (!Fl_Type::current) {
    fl_beep();
    return;
  }
  undo_checkpoint();
  set_modflag(1);
  ipasteoffset = 0;
  Fl_Type *p = Fl_Type::current->parent;
  while (p && p->selected) p = p->parent;
  delete_all(1);
  if (p) select_only(p);
}